

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

MatcherBase<const_std::tuple<const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&>_&>
* __thiscall
testing::internal::
MatcherBase<const_std::tuple<const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&>_&>
::operator=(MatcherBase<const_std::tuple<const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&>_&>
            *this,MatcherBase<const_std::tuple<const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&>_&>
                  *other)

{
  VTable *pVVar1;
  SharedPayloadBase *pSVar2;
  
  if (this != other) {
    Destroy(this);
    pVVar1 = other->vtable_;
    this->vtable_ = pVVar1;
    pSVar2 = (other->buffer_).shared;
    (this->buffer_).shared = pSVar2;
    if ((pVVar1 != (VTable *)0x0) &&
       (pVVar1->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
      LOCK();
      (pSVar2->ref).super___atomic_base<int>._M_i = (pSVar2->ref).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return this;
}

Assistant:

MatcherBase& operator=(const MatcherBase& other) {
    if (this == &other) return *this;
    Destroy();
    vtable_ = other.vtable_;
    buffer_ = other.buffer_;
    if (IsShared()) buffer_.shared->Ref();
    return *this;
  }